

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.cpp
# Opt level: O0

void __thiscall Pathie::TempEntry::TempEntry(TempEntry *this,string *namepart)

{
  bool bVar1;
  string local_88 [48];
  Path local_58;
  Path local_38;
  string *local_18;
  string *namepart_local;
  TempEntry *this_local;
  
  this->_vptr_TempEntry = (_func_int **)&PTR__TempEntry_0011dc80;
  this->m_keep = false;
  local_18 = namepart;
  namepart_local = (string *)this;
  Path::Path(&this->m_path);
  do {
    Path::temp_dir();
    generate_random_filename(local_88);
    Path::operator/(&local_38,&local_58,local_88);
    Path::operator=(&this->m_path,&local_38);
    Path::~Path(&local_38);
    std::__cxx11::string::~string((string *)local_88);
    Path::~Path(&local_58);
    bVar1 = Path::exists(&this->m_path);
  } while (bVar1);
  return;
}

Assistant:

TempEntry::TempEntry(std::string namepart)
  : m_keep(false)
{
  do {
    m_path = Path::temp_dir() / generate_random_filename(namepart);
  } while (m_path.exists());
}